

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

void __thiscall cppnet::RWSocket::StopTimer(RWSocket *this)

{
  int iVar1;
  Dispatcher *this_00;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar3;
  
  if (this->_timer_id != 0) {
    this_01 = (this->super_Socket)._dispatcher.
              super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar2 = this_01->_M_use_count;
      do {
        if (iVar2 == 0) {
          this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = this_01->_M_use_count;
        bVar3 = iVar2 == iVar1;
        if (bVar3) {
          this_01->_M_use_count = iVar2 + 1;
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        UNLOCK();
      } while (!bVar3);
    }
    if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = this_01->_M_use_count == 0;
    }
    this_00 = (this->super_Socket)._dispatcher.
              super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (!(bool)(this_00 == (Dispatcher *)0x0 | bVar3)) {
      Dispatcher::StopTimer(this_00,this->_timer_id);
      this->_timer_id = 0;
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      return;
    }
  }
  return;
}

Assistant:

void RWSocket::StopTimer() {
    if (_timer_id == 0) {
        return;
    }
    
    auto dispatcher = GetDispatcher();
    if (dispatcher) {
        dispatcher->StopTimer(_timer_id);
        _timer_id = 0;
    }
}